

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher_manager.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Method_dispatcher_manager::get_methods_list(Method_dispatcher_manager *this,Array *retval)

{
  bool bVar1;
  reference ppMVar2;
  iterator local_78;
  iterator local_58;
  undefined1 local_38 [8];
  CI i;
  Array *retval_local;
  Method_dispatcher_manager *this_local;
  
  i._M_node = (_Map_pointer)retval;
  std::
  deque<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>::
  begin(&local_58,&this->impl_->dispatchers);
  std::
  _Deque_iterator<iqxmlrpc::Method_dispatcher_base*,iqxmlrpc::Method_dispatcher_base*const&,iqxmlrpc::Method_dispatcher_base*const*>
  ::
  _Deque_iterator<std::_Deque_iterator<iqxmlrpc::Method_dispatcher_base*,iqxmlrpc::Method_dispatcher_base*&,iqxmlrpc::Method_dispatcher_base**>,void>
            ((_Deque_iterator<iqxmlrpc::Method_dispatcher_base*,iqxmlrpc::Method_dispatcher_base*const&,iqxmlrpc::Method_dispatcher_base*const*>
              *)local_38,&local_58);
  while( true ) {
    std::
    deque<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>::
    end(&local_78,&this->impl_->dispatchers);
    bVar1 = std::operator!=((_Self *)local_38,&local_78);
    if (!bVar1) break;
    ppMVar2 = std::
              _Deque_iterator<iqxmlrpc::Method_dispatcher_base_*,_iqxmlrpc::Method_dispatcher_base_*const_&,_iqxmlrpc::Method_dispatcher_base_*const_*>
              ::operator*((_Deque_iterator<iqxmlrpc::Method_dispatcher_base_*,_iqxmlrpc::Method_dispatcher_base_*const_&,_iqxmlrpc::Method_dispatcher_base_*const_*>
                           *)local_38);
    Method_dispatcher_base::get_methods_list(*ppMVar2,(Array *)i._M_node);
    std::
    _Deque_iterator<iqxmlrpc::Method_dispatcher_base_*,_iqxmlrpc::Method_dispatcher_base_*const_&,_iqxmlrpc::Method_dispatcher_base_*const_*>
    ::operator++((_Deque_iterator<iqxmlrpc::Method_dispatcher_base_*,_iqxmlrpc::Method_dispatcher_base_*const_&,_iqxmlrpc::Method_dispatcher_base_*const_*>
                  *)local_38);
  }
  return;
}

Assistant:

void Method_dispatcher_manager::get_methods_list(Array& retval) const
{
  typedef Impl::DispatchersSet::const_iterator CI;
  for (CI i = impl_->dispatchers.begin(); i != impl_->dispatchers.end(); ++i)
    (*i)->get_methods_list(retval);
}